

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O3

HMInteger __thiscall hypermind::CompileUnit::AddConstant(CompileUnit *this,Value *value)

{
  uint uVar1;
  HMFunction *pHVar2;
  VM *pVVar3;
  anon_union_8_3_be54641b_for_Value_1 aVar4;
  undefined4 uVar5;
  HMUINT32 HVar6;
  Value *pVVar7;
  uint uVar8;
  
  pHVar2 = this->mFn;
  uVar8 = (pHVar2->constants).count;
  uVar1 = (pHVar2->constants).capacity;
  HVar6 = uVar8 + 1;
  if (uVar1 < HVar6) {
    pVVar3 = this->mVM;
    HVar6 = CeilToPowerOf2(HVar6);
    (pHVar2->constants).capacity = HVar6;
    pVVar7 = (Value *)GCHeap::MemManger(&pVVar3->mGCHeap,(pHVar2->constants).data,(ulong)uVar1 << 4,
                                        (ulong)HVar6 << 4);
    (pHVar2->constants).data = pVVar7;
    uVar8 = (pHVar2->constants).count;
    HVar6 = uVar8 + 1;
  }
  else {
    pVVar7 = (pHVar2->constants).data;
  }
  (pHVar2->constants).count = HVar6;
  uVar5 = *(undefined4 *)&value->field_0x4;
  aVar4 = value->field_1;
  pVVar7 = pVVar7 + uVar8;
  pVVar7->type = value->type;
  *(undefined4 *)&pVVar7->field_0x4 = uVar5;
  pVVar7->field_1 = aVar4;
  return (pHVar2->constants).count - 1;
}

Assistant:

HMInteger AddConstant(const Value &value) {
            // TODO 现在直接将value存到constants中了
            //  相同的文本或者数值会造成资源重复 可以先取hash
            return mFn->constants.push(&mVM->mGCHeap, value);
        }